

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptbuilder.cpp
# Opt level: O3

void __thiscall
ScriptBuilder_AppendFunctionTest1ByOperator_Test::~ScriptBuilder_AppendFunctionTest1ByOperator_Test
          (ScriptBuilder_AppendFunctionTest1ByOperator_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptBuilder, AppendFunctionTest1ByOperator) {
  std::string sig =
  "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e";  // NOLINT
  std::string pubkey =
  "042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0";// NOLINT
  std::string pubkey_hash = "aea58b2d64af22fe06b95c46af4e471e6280226c";

  // ref: https://en.bitcoin.it/wiki/Script#Script_examples
  // Freezing funds until a time in the future
  Script actual = (ScriptBuilder() << sig << Pubkey(pubkey) << 144
      << ScriptType::kOpCheckLockTimeVerify
      << ScriptOperator::OP_DROP << ScriptOperator::OP_DUP
      << ScriptOperator::OP_HASH160 << ByteData160(pubkey_hash)
      << ScriptOperator::OP_EQUALVERIFY << ScriptOperator::OP_CHECKSIG).Build();

  std::string expect_hex =
  "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b17576a914aea58b2d64af22fe06b95c46af4e471e6280226c88ac";// NOLINT
  std::string expect_asm =
  "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP OP_DUP OP_HASH160 aea58b2d64af22fe06b95c46af4e471e6280226c OP_EQUALVERIFY OP_CHECKSIG";// NOLINT
  size_t expect_size = 10;

  EXPECT_STREQ(expect_hex.c_str(), actual.GetHex().c_str());
  EXPECT_STREQ(expect_asm.c_str(), actual.ToString().c_str());
  EXPECT_EQ(expect_size, actual.GetElementList().size());
}